

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ButtonWidget.cpp
# Opt level: O0

void __thiscall ButtonWidget::render(ButtonWidget *this,bool selected)

{
  int iVar1;
  int iVar2;
  byte in_SIL;
  long in_RDI;
  undefined8 uVar3;
  undefined8 in_XMM1_Qa;
  ResourceManager *rm;
  ALLEGRO_FONT *myfont;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  void *local_18;
  
  ResourceManager::getInstance();
  if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
    if ((in_SIL & 1) == 0) {
      local_18 = ResourceManager::getData
                           ((ResourceManager *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac);
    }
    else {
      local_18 = ResourceManager::getData
                           ((ResourceManager *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac);
    }
    uVar3 = al_map_rgb(0xff,0xff);
    iVar1 = *(int *)(in_RDI + 8);
    iVar4 = *(int *)(in_RDI + 0xc);
    iVar2 = al_get_font_line_height(local_18);
    al_draw_textf(uVar3,in_XMM1_Qa,(float)iVar1,(float)(iVar4 - iVar2 / 2),local_18,1,"%s",
                  *(undefined8 *)(in_RDI + 0x18));
  }
  return;
}

Assistant:

void ButtonWidget::render(bool selected)
{
   ALLEGRO_FONT *myfont;
   ResourceManager& rm = ResourceManager::getInstance();

   if (center) {
      if (selected) {
         myfont = (ALLEGRO_FONT *)rm.getData(RES_LARGEFONT);
      }
      else {
         myfont = (ALLEGRO_FONT *)rm.getData(RES_SMALLFONT);
      }
      al_draw_textf(myfont, al_map_rgb(255, 255, 255), x, y-al_get_font_line_height(myfont)/2, ALLEGRO_ALIGN_CENTRE, "%s", text);
   }
}